

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

void __thiscall CholeskyFactor::resize(CholeskyFactor *this,HighsInt new_k_max)

{
  value_type vVar1;
  int *piVar2;
  reference pvVar3;
  int in_ESI;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  HighsInt j;
  HighsInt i;
  HighsInt min_k_max;
  HighsInt l_size;
  vector<double,_std::allocator<double>_> L_old;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x20);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x762834);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20));
  piVar2 = std::min<int>((int *)&stack0xfffffffffffffff4,(int *)(in_RDI + 0x1c));
  iVar6 = *piVar2;
  for (iVar5 = 0; iVar5 < iVar6; iVar5 = iVar5 + 1) {
    for (iVar4 = 0; iVar4 < iVar6; iVar4 = iVar4 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd8,
                          (long)(iVar5 * *(int *)(in_RDI + 0x1c) + iVar4));
      vVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                          (long)(iVar5 * in_ESI + iVar4));
      *pvVar3 = vVar1;
    }
  }
  *(int *)(in_RDI + 0x1c) = in_ESI;
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return;
}

Assistant:

void resize(HighsInt new_k_max) {
    std::vector<double> L_old = L;
    L.clear();
    L.resize((new_k_max) * (new_k_max));
    const HighsInt l_size = L.size();
    // Driven by #958, changes made in following lines to avoid array
    // bound error when new_k_max < current_k_max
    HighsInt min_k_max = min(new_k_max, current_k_max);
    for (HighsInt i = 0; i < min_k_max; i++) {
      for (HighsInt j = 0; j < min_k_max; j++) {
        assert(i * (new_k_max) + j < l_size);
        L[i * (new_k_max) + j] = L_old[i * current_k_max + j];
      }
    }
    current_k_max = new_k_max;
  }